

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_privileged.inc.c
# Opt level: O3

_Bool trans_mret(DisasContext_conflict12 *ctx,arg_mret *a)

{
  TCGContext_conflict11 *pTVar1;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 uVar2;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  pTVar1 = ctx->uc->tcg_ctx;
  tcg_gen_op2_riscv64(pTVar1,INDEX_op_movi_i64,(TCGArg)(pTVar1->cpu_pc + (long)pTVar1),
                      (ctx->base).pc_next);
  local_28 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
  local_20 = (TCGTemp *)(pTVar1->cpu_pc + (long)pTVar1);
  tcg_gen_callN_riscv64(pTVar1,helper_mret_riscv64,local_20,2,&local_28);
  pTVar1 = ctx->uc->tcg_ctx;
  if ((ctx->base).singlestep_enabled == true) {
    gen_exception_debug(pTVar1);
    uVar2 = extraout_AL;
  }
  else {
    tcg_gen_exit_tb_riscv64(pTVar1,(TranslationBlock *)0x0,0);
    uVar2 = extraout_AL_00;
  }
  (ctx->base).is_jmp = DISAS_NORETURN;
  return (_Bool)uVar2;
}

Assistant:

static bool trans_mret(DisasContext *ctx, arg_mret *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, ctx->base.pc_next);
    gen_helper_mret(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->cpu_env, tcg_ctx->cpu_pc);
    exit_tb(ctx); /* no chaining */
    ctx->base.is_jmp = DISAS_NORETURN;
    return true;
}